

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_shl_long_Test::TestBody(correctness_shl_long_Test *this)

{
  char *pcVar1;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  AssertionResult gtest_ar;
  big_integer local_1e0;
  big_integer local_1a8;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  big_integer local_b0;
  big_integer local_78;
  big_integer local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"1091951238831590836520041079875950759639875963123939936",
             &local_1f1);
  big_integer::big_integer(&local_1a8,&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"34123476213487213641251283746123461238746123847623123",&local_1f2)
  ;
  big_integer::big_integer(&local_40,&local_f0);
  ::operator<<(&local_1e0,&local_40,5);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            ((internal *)&gtest_ar,
             "big_integer(\"1091951238831590836520041079875950759639875963123939936\")",
             "big_integer(\"34123476213487213641251283746123461238746123847623123\") << 5",
             &local_1a8,&local_1e0);
  big_integer::~big_integer(&local_1e0);
  big_integer::~big_integer(&local_40);
  std::__cxx11::string::~string((string *)&local_f0);
  big_integer::~big_integer(&local_1a8);
  std::__cxx11::string::~string((string *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x243,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"-104637598388784443044449444577438556334703518260785595038524928"
             ,&local_1f1);
  big_integer::big_integer(&local_1a8,&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"-817481237412378461284761285761238721364871236412387461238476",
             &local_1f2);
  big_integer::big_integer(&local_78,&local_130);
  ::operator<<(&local_1e0,&local_78,7);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            ((internal *)&gtest_ar,
             "big_integer(\"-104637598388784443044449444577438556334703518260785595038524928\")",
             "big_integer(\"-817481237412378461284761285761238721364871236412387461238476\") << 7",
             &local_1a8,&local_1e0);
  big_integer::~big_integer(&local_1e0);
  big_integer::~big_integer(&local_78);
  std::__cxx11::string::~string((string *)&local_130);
  big_integer::~big_integer(&local_1a8);
  std::__cxx11::string::~string((string *)&local_110);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x246,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,
             "26502603392713913241969902328696116541550413468869982914247384891392",&local_1f1);
  big_integer::big_integer(&local_1a8,&local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"12341236412857618761234871264871264128736412836643859238479",
             &local_1f2);
  big_integer::big_integer(&local_b0,&local_170);
  ::operator<<(&local_1e0,&local_b0,0x1f);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            ((internal *)&gtest_ar,
             "big_integer(\"26502603392713913241969902328696116541550413468869982914247384891392\")"
             ,"big_integer(\"12341236412857618761234871264871264128736412836643859238479\") << 31",
             &local_1a8,&local_1e0);
  big_integer::~big_integer(&local_1e0);
  big_integer::~big_integer(&local_b0);
  std::__cxx11::string::~string((string *)&local_170);
  big_integer::~big_integer(&local_1a8);
  std::__cxx11::string::~string((string *)&local_150);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x249,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(correctness, shl_long)
{
    EXPECT_EQ(big_integer("1091951238831590836520041079875950759639875963123939936"),
              big_integer("34123476213487213641251283746123461238746123847623123") << 5);

    EXPECT_EQ(big_integer("-104637598388784443044449444577438556334703518260785595038524928"),
              big_integer("-817481237412378461284761285761238721364871236412387461238476") << 7);

    EXPECT_EQ(big_integer("26502603392713913241969902328696116541550413468869982914247384891392"),
              big_integer("12341236412857618761234871264871264128736412836643859238479") << 31);
}